

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayFeatureExtractor.pb.h
# Opt level: O1

void __thiscall
CoreML::Specification::ArrayFeatureExtractor::_internal_add_extractindex
          (ArrayFeatureExtractor *this,uint64_t value)

{
  RepeatedField<unsigned_long> *this_00;
  uint uVar1;
  uint uVar2;
  unsigned_long *puVar3;
  unsigned_long tmp;
  
  this_00 = &this->extractindex_;
  uVar1 = (this->extractindex_).current_size_;
  uVar2 = (this->extractindex_).total_size_;
  if (uVar1 == uVar2) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(this_00,uVar2 + 1);
  }
  puVar3 = google::protobuf::RepeatedField<unsigned_long>::elements(this_00);
  puVar3[uVar1] = value;
  this_00->current_size_ = uVar1 + 1;
  return;
}

Assistant:

inline void ArrayFeatureExtractor::_internal_add_extractindex(uint64_t value) {
  extractindex_.Add(value);
}